

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

int Ivy_ManFindBoolCutCost(Ivy_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  int Cost;
  Ivy_Obj_t *pObj_local;
  
  if ((*(uint *)&pObj->field_0x8 >> 4 & 1) == 1) {
    iVar2 = Ivy_ObjIsCi(pObj);
    if (iVar2 == 0) {
      iVar2 = Ivy_ObjIsBuf(pObj);
      if (iVar2 == 0) {
        pIVar3 = Ivy_ObjFanin0(pObj);
        uVar1 = *(uint *)&pIVar3->field_0x8;
        pIVar3 = Ivy_ObjFanin1(pObj);
        pObj_local._4_4_ =
             (uint)(((uVar1 >> 4 & 1) != 0 ^ 0xffU) & 1) +
             (uint)(((*(uint *)&pIVar3->field_0x8 >> 4 & 1) != 0 ^ 0xffU) & 1);
      }
      else {
        pIVar3 = Ivy_ObjFanin0(pObj);
        pObj_local._4_4_ = (uint)(((*(uint *)&pIVar3->field_0x8 >> 4 & 1) != 0 ^ 0xffU) & 1);
      }
    }
    else {
      pObj_local._4_4_ = 999;
    }
    return pObj_local._4_4_;
  }
  __assert_fail("pObj->fMarkA == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                ,0x118,"int Ivy_ManFindBoolCutCost(Ivy_Obj_t *)");
}

Assistant:

int Ivy_ManFindBoolCutCost( Ivy_Obj_t * pObj )
{
    int Cost;
    // make sure the node is in the construction zone
    assert( pObj->fMarkA == 1 );  
    // cannot expand over the PI node
    if ( Ivy_ObjIsCi(pObj) )
        return 999;
    // always expand over the buffer
    if ( Ivy_ObjIsBuf(pObj) )
        return !Ivy_ObjFanin0(pObj)->fMarkA;
    // get the cost of the cone
    Cost = (!Ivy_ObjFanin0(pObj)->fMarkA) + (!Ivy_ObjFanin1(pObj)->fMarkA);
    // return the number of nodes to be added to the leaves if this node is removed
    return Cost;
}